

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::dumpHGeneric(QPDF *this,HGeneric *t)

{
  pointer this_00;
  element_type *peVar1;
  element_type *this_01;
  Pipeline *pPVar2;
  qpdf_offset_t i;
  shared_ptr<Pipeline> local_28;
  HGeneric *local_18;
  HGeneric *t_local;
  QPDF *this_local;
  
  local_18 = t;
  t_local = (HGeneric *)this;
  this_00 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                      (&this->m);
  peVar1 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this_00);
  QPDFLogger::getInfo((QPDFLogger *)&local_28,SUB81(peVar1,0));
  this_01 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                      ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &local_28);
  pPVar2 = Pipeline::operator<<(this_01,"first_object: ");
  pPVar2 = Pipeline::operator<<(pPVar2,local_18->first_object);
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"first_object_offset: ");
  i = adjusted_offset(this,local_18->first_object_offset);
  pPVar2 = Pipeline::operator<<(pPVar2,i);
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"nobjects: ");
  pPVar2 = Pipeline::operator<<(pPVar2,local_18->nobjects);
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"group_length: ");
  pPVar2 = Pipeline::operator<<(pPVar2,local_18->group_length);
  Pipeline::operator<<(pPVar2,"\n");
  std::shared_ptr<Pipeline>::~shared_ptr(&local_28);
  return;
}

Assistant:

void
QPDF::dumpHGeneric(HGeneric& t)
{
    *m->log->getInfo() << "first_object: " << t.first_object << "\n"
                       << "first_object_offset: " << adjusted_offset(t.first_object_offset) << "\n"
                       << "nobjects: " << t.nobjects << "\n"
                       << "group_length: " << t.group_length << "\n";
}